

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall
QHttpNetworkReplyPrivate::readReplyBodyRaw
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out,qint64 size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  qint64 local_68;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (**(code **)(*(long *)socket + 0xa0))(socket);
  if (size <= (long)uVar3) {
    uVar3 = size;
  }
  if (0x1ffff < (long)uVar3) {
    uVar3 = 0x20000;
  }
  uVar1 = this->readBufferMaxSize;
  uVar4 = uVar1;
  if ((long)(int)uVar3 < (long)uVar1) {
    uVar4 = (long)(int)uVar3;
  }
  if (uVar1 != 0) {
    uVar3 = uVar4;
  }
  uVar3 = uVar3 & 0xffffffff;
  lVar7 = 0;
  do {
    lVar2 = lVar7;
    if ((int)uVar3 < 1) break;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char *)0x0;
    local_58.size = 0;
    QByteArray::resize((longlong)&local_58);
    pcVar5 = QByteArray::data((QByteArray *)&local_58);
    lVar6 = QIODevice::read((char *)socket,(longlong)pcVar5);
    if (lVar6 < 1) {
      QByteArray::clear();
      local_68 = lVar7;
    }
    else {
      QByteArray::resize((longlong)&local_58);
      QByteDataBuffer::append(out,(QByteArray *)&local_58);
      lVar7 = lVar7 + lVar6;
      size = size - lVar6;
      uVar3 = (**(code **)(*(long *)socket + 0xa0))(socket);
      if (size < (long)uVar3) {
        uVar3 = size;
      }
      if (0x1ffff < (long)uVar3) {
        uVar3 = 0x20000;
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    lVar2 = local_68;
  } while (0 < lVar6);
  local_68 = lVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readReplyBodyRaw(QIODevice *socket, QByteDataBuffer *out, qint64 size)
{
    // FIXME get rid of this function and just use readBodyFast and give it socket->bytesAvailable()
    qint64 bytes = 0;
    Q_ASSERT(socket);
    Q_ASSERT(out);

    int toBeRead = qMin<qint64>(128*1024, qMin<qint64>(size, socket->bytesAvailable()));

    if (readBufferMaxSize)
        toBeRead = qMin<qint64>(toBeRead, readBufferMaxSize);

    while (toBeRead > 0) {
        QByteArray byteData;
        byteData.resize(toBeRead);
        qint64 haveRead = socket->read(byteData.data(), byteData.size());
        if (haveRead <= 0) {
            // ### error checking here
            byteData.clear();
            return bytes;
        }

        byteData.resize(haveRead);
        out->append(byteData);
        bytes += haveRead;
        size -= haveRead;

        toBeRead = qMin<qint64>(128*1024, qMin<qint64>(size, socket->bytesAvailable()));
    }
    return bytes;

}